

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int c1f5kb_(int *ido,int *l1,int *na,double *cc,int *in1,double *ch,int *in2,double *wa)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  double *pdVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  double *pdVar18;
  ulong uVar19;
  double *pdVar20;
  long lVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  ulong local_138;
  double *local_130;
  double *local_128;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  double *local_a8;
  
  uVar1 = *ido;
  uVar13 = (ulong)uVar1;
  iVar3 = uVar1 * 5 + 1;
  lVar17 = (long)*in1;
  uVar2 = *l1;
  local_138 = (ulong)uVar2;
  uVar8 = uVar2 * (uVar1 + 1);
  lVar15 = (long)(int)(~uVar8 * *in1 + -1);
  lVar21 = (long)*in2;
  if (((int)uVar1 < 2) && (*na != 1)) {
    if (0 < (int)uVar2) {
      pdVar7 = cc + ((long)(int)uVar8 + 1) * lVar17 + 1;
      pdVar12 = cc + ((long)(int)((uVar1 * 4 + 1) * uVar2) + 1) * lVar17 + 1;
      pdVar14 = cc + ((long)(int)((uVar1 * 3 + 1) * uVar2) + 1) * lVar17 + 1;
      pdVar16 = cc + ((long)(int)(iVar3 * uVar2) + 1) * lVar17 + 1;
      pdVar18 = cc + ((long)(int)((uVar1 * 2 + 1) * uVar2) + 1) * lVar17 + 1;
      do {
        dVar29 = pdVar18[lVar15];
        dVar33 = (pdVar18 + lVar15)[1];
        dVar26 = pdVar16[lVar15];
        dVar27 = (pdVar16 + lVar15)[1];
        dVar36 = dVar29 - dVar26;
        dVar37 = dVar33 - dVar27;
        dVar28 = pdVar14[lVar15];
        dVar30 = (pdVar14 + lVar15)[1];
        dVar31 = pdVar12[lVar15];
        dVar32 = (pdVar12 + lVar15)[1];
        dVar34 = dVar28 - dVar31;
        dVar35 = dVar30 - dVar32;
        dVar29 = dVar29 + dVar26;
        dVar33 = dVar33 + dVar27;
        dVar28 = dVar28 + dVar31;
        dVar30 = dVar30 + dVar32;
        dVar26 = pdVar7[lVar15];
        dVar27 = (pdVar7 + lVar15)[1];
        dVar31 = dVar28 * -0.8090169943749475 + dVar29 * 0.3090169943749474 + dVar26;
        dVar38 = dVar30 * -0.8090169943749475 + dVar33 * 0.3090169943749474 + dVar27;
        pdVar7[lVar15] = dVar29 + dVar26 + dVar28;
        (pdVar7 + lVar15)[1] = dVar33 + dVar27 + dVar30;
        dVar39 = dVar36 * 0.9510565162951536 + dVar34 * 0.5877852522924731;
        dVar32 = dVar37 * 0.9510565162951536 + dVar35 * 0.5877852522924731;
        pdVar18[lVar15] = dVar31 - dVar32;
        pdVar16[lVar15] = dVar32 + dVar31;
        pdVar18[lVar15 + 1] = dVar39 + dVar38;
        dVar29 = dVar28 * 0.3090169943749474 + dVar29 * -0.8090169943749475 + dVar26;
        dVar26 = dVar36 * 0.5877852522924731 + dVar34 * -0.9510565162951536;
        dVar28 = dVar37 * 0.5877852522924731 + dVar35 * -0.9510565162951536;
        dVar33 = dVar30 * 0.3090169943749474 + dVar33 * -0.8090169943749475 + dVar27;
        pdVar14[lVar15] = dVar29 - dVar28;
        (pdVar14 + lVar15)[1] = dVar26 + dVar33;
        pdVar12[lVar15] = dVar29 + dVar28;
        (pdVar12 + lVar15)[1] = dVar33 - dVar26;
        pdVar16[lVar15 + 1] = dVar38 - dVar39;
        pdVar7 = pdVar7 + lVar17;
        pdVar12 = pdVar12 + lVar17;
        pdVar14 = pdVar14 + lVar17;
        pdVar16 = pdVar16 + lVar17;
        pdVar18 = pdVar18 + lVar17;
        local_138 = local_138 - 1;
      } while (local_138 != 0);
    }
  }
  else {
    lVar11 = (long)(int)(~(uVar2 * 6) * *in2 + -1);
    if (0 < (int)uVar2) {
      pdVar7 = ch + ((ulong)(uVar2 * 9) + 1) * lVar21 + 1;
      pdVar18 = ch + ((long)(int)(uVar2 * 8) + 1) * lVar21 + 1;
      pdVar20 = ch + ((ulong)(uVar2 * 10) + 1) * lVar21 + 2;
      pdVar22 = ch + ((ulong)(uVar2 * 7) + 1) * lVar21 + 2;
      pdVar12 = ch + ((ulong)(uVar2 * 6) + 1) * lVar21 + 2;
      pdVar16 = cc + ((long)(int)uVar8 + 1) * lVar17 + 2;
      pdVar25 = cc + ((long)(int)((uVar1 * 4 + 1) * uVar2) + 1) * lVar17 + 2;
      pdVar23 = cc + ((long)(int)((uVar1 * 3 + 1) * uVar2) + 1) * lVar17 + 2;
      pdVar24 = cc + ((long)(int)(iVar3 * uVar2) + 1) * lVar17 + 2;
      pdVar14 = cc + ((long)(int)((uVar1 * 2 + 1) * uVar2) + 1) * lVar17 + 2;
      do {
        dVar32 = pdVar14[lVar15] - pdVar24[lVar15];
        dVar26 = pdVar14[lVar15] + pdVar24[lVar15];
        dVar31 = pdVar23[lVar15] - pdVar25[lVar15];
        dVar37 = pdVar23[lVar15] + pdVar25[lVar15];
        dVar35 = pdVar14[lVar15 + -1] - pdVar24[lVar15 + -1];
        dVar30 = pdVar14[lVar15 + -1] + pdVar24[lVar15 + -1];
        dVar34 = pdVar23[lVar15 + -1] - pdVar25[lVar15 + -1];
        dVar28 = pdVar23[lVar15 + -1] + pdVar25[lVar15 + -1];
        pdVar12[lVar11 + -1] = pdVar16[lVar15 + -1] + dVar30 + dVar28;
        pdVar12[lVar11] = pdVar16[lVar15] + dVar26 + dVar37;
        dVar29 = pdVar16[lVar15 + -1];
        dVar33 = pdVar16[lVar15];
        dVar39 = dVar28 * -0.8090169943749475 + dVar30 * 0.3090169943749474 + dVar29;
        dVar38 = dVar37 * -0.8090169943749475 + dVar26 * 0.3090169943749474 + dVar33;
        dVar36 = dVar35 * 0.9510565162951536 + dVar34 * 0.5877852522924731;
        dVar27 = dVar32 * 0.9510565162951536 + dVar31 * 0.5877852522924731;
        pdVar22[lVar11 + -1] = dVar39 - dVar27;
        pdVar20[lVar11 + -1] = dVar27 + dVar39;
        pdVar22[lVar11] = dVar36 + dVar38;
        dVar29 = dVar28 * 0.3090169943749474 + dVar30 * -0.8090169943749475 + dVar29;
        dVar27 = dVar35 * 0.5877852522924731 + dVar34 * -0.9510565162951536;
        dVar28 = dVar32 * 0.5877852522924731 + dVar31 * -0.9510565162951536;
        dVar33 = dVar37 * 0.3090169943749474 + dVar26 * -0.8090169943749475 + dVar33;
        pdVar18[lVar11] = dVar29 - dVar28;
        (pdVar18 + lVar11)[1] = dVar27 + dVar33;
        pdVar7[lVar11] = dVar29 + dVar28;
        (pdVar7 + lVar11)[1] = dVar33 - dVar27;
        pdVar20[lVar11] = dVar38 - dVar36;
        pdVar7 = pdVar7 + lVar21;
        pdVar18 = pdVar18 + lVar21;
        pdVar20 = pdVar20 + lVar21;
        pdVar22 = pdVar22 + lVar21;
        pdVar12 = pdVar12 + lVar21;
        pdVar16 = pdVar16 + lVar17;
        pdVar25 = pdVar25 + lVar17;
        pdVar23 = pdVar23 + lVar17;
        pdVar24 = pdVar24 + lVar17;
        pdVar14 = pdVar14 + lVar17;
        local_138 = local_138 - 1;
      } while (local_138 != 0);
    }
    if (1 < (int)uVar1) {
      uVar8 = uVar1 * 5;
      lVar4 = (long)(int)uVar2;
      local_a8 = ch + (lVar4 * 0xf + 1) * lVar21 + 2;
      local_b0 = ch + (lVar4 * 0xe | 1U) * lVar21 + 2;
      local_b8 = ch + (lVar4 * 0xd + 1) * lVar21 + 2;
      local_c0 = ch + (lVar4 * 0xc + 1) * lVar21 + 2;
      local_c8 = ch + (lVar4 * 0xb + 1) * lVar21 + 2;
      local_d0 = cc + ((uVar13 + 2) * lVar4 + 1) * lVar17 + 2;
      local_d8 = cc + (((long)(int)(uVar1 * 4) | 2U) * lVar4 + 1) * lVar17 + 2;
      local_e0 = cc + (((ulong)(uVar1 * 3) + 2) * lVar4 + 1) * lVar17 + 2;
      local_e8 = cc + (((ulong)uVar8 + 2) * lVar4 + 1) * lVar17 + 2;
      local_f0 = cc + (((long)(int)(uVar1 * 2) + 2) * lVar4 + 1) * lVar17 + 2;
      uVar9 = ~uVar8;
      lVar5 = lVar4 * lVar21;
      lVar4 = lVar4 * lVar17;
      uVar19 = 2;
      do {
        if (0 < (int)uVar2) {
          lVar6 = uVar8 + uVar19;
          local_130 = local_b8;
          local_128 = local_a8;
          lVar10 = (ulong)(uVar2 + 1) - 1;
          pdVar7 = local_f0;
          pdVar12 = local_e8;
          pdVar14 = local_c0;
          pdVar16 = local_d8;
          pdVar18 = local_b0;
          pdVar20 = local_e0;
          pdVar22 = local_c8;
          pdVar23 = local_d0;
          do {
            dVar29 = pdVar20[lVar15 + -1];
            dVar33 = pdVar16[lVar15 + -1];
            dVar28 = pdVar7[lVar15] + pdVar12[lVar15];
            dVar27 = pdVar20[lVar15] + pdVar16[lVar15];
            dVar26 = pdVar7[lVar15] - pdVar12[lVar15];
            dVar34 = pdVar7[lVar15 + -1] + pdVar12[lVar15 + -1];
            dVar30 = dVar29 + dVar33;
            dVar35 = pdVar20[lVar15] - pdVar16[lVar15];
            dVar31 = pdVar7[lVar15 + -1] - pdVar12[lVar15 + -1];
            pdVar22[lVar11 + -1] = pdVar23[lVar15 + -1] + dVar34 + dVar30;
            dVar29 = dVar29 - dVar33;
            pdVar22[lVar11] = pdVar23[lVar15] + dVar28 + dVar27;
            dVar32 = dVar30 * -0.8090169943749475 +
                     dVar34 * 0.3090169943749474 + pdVar23[lVar15 + -1];
            dVar37 = dVar27 * -0.8090169943749475 + dVar28 * 0.3090169943749474 + pdVar23[lVar15];
            dVar36 = dVar31 * 0.9510565162951536 + dVar29 * 0.5877852522924731;
            dVar33 = dVar26 * 0.9510565162951536 + dVar35 * 0.5877852522924731;
            dVar30 = dVar30 * 0.3090169943749474 +
                     dVar34 * -0.8090169943749475 + pdVar23[lVar15 + -1];
            dVar31 = dVar31 * 0.5877852522924731 + dVar29 * -0.9510565162951536;
            dVar29 = dVar26 * 0.5877852522924731 + dVar35 * -0.9510565162951536;
            dVar27 = dVar27 * 0.3090169943749474 + dVar28 * -0.8090169943749475 + pdVar23[lVar15];
            dVar28 = dVar33 + dVar32;
            dVar32 = dVar32 - dVar33;
            dVar34 = dVar37 - dVar36;
            dVar36 = dVar36 + dVar37;
            pdVar14[lVar11 + -1] =
                 wa[(int)uVar9 + lVar6] * dVar32 -
                 wa[(long)(int)uVar9 + uVar13 * 9 + uVar19] * dVar36;
            dVar26 = dVar31 + dVar27;
            dVar33 = dVar30 - dVar29;
            pdVar14[lVar11] =
                 dVar36 * wa[(int)uVar9 + lVar6] +
                 dVar32 * wa[(long)(int)uVar9 + uVar13 * 9 + uVar19];
            local_130[lVar11 + -1] =
                 wa[(long)(int)uVar9 + uVar13 * 6 + uVar19] * dVar33 -
                 wa[(long)(int)uVar9 + uVar13 * 10 + uVar19] * dVar26;
            dVar27 = dVar27 - dVar31;
            local_130[lVar11] =
                 dVar26 * wa[(long)(int)uVar9 + uVar13 * 6 + uVar19] +
                 dVar33 * wa[(long)(int)uVar9 + uVar13 * 10 + uVar19];
            dVar29 = dVar29 + dVar30;
            pdVar18[lVar11 + -1] =
                 wa[(long)(int)uVar9 + uVar13 * 7 + uVar19] * dVar29 -
                 wa[(long)(int)uVar9 + uVar13 * 0xb + uVar19] * dVar27;
            pdVar18[lVar11] =
                 dVar27 * wa[(long)(int)uVar9 + uVar13 * 7 + uVar19] +
                 dVar29 * wa[(long)(int)uVar9 + uVar13 * 0xb + uVar19];
            local_128[lVar11 + -1] =
                 wa[(long)(int)uVar9 + (long)(int)(uVar1 * 8) + uVar19] * dVar28 -
                 wa[(long)(int)uVar9 + uVar13 * 0xc + uVar19] * dVar34;
            local_128[lVar11] =
                 dVar34 * wa[(long)(int)uVar9 + (long)(int)(uVar1 * 8) + uVar19] +
                 dVar28 * wa[(long)(int)uVar9 + uVar13 * 0xc + uVar19];
            local_130 = local_130 + lVar21;
            pdVar14 = pdVar14 + lVar21;
            pdVar18 = pdVar18 + lVar21;
            pdVar22 = pdVar22 + lVar21;
            pdVar23 = pdVar23 + lVar17;
            pdVar16 = pdVar16 + lVar17;
            local_128 = local_128 + lVar21;
            pdVar20 = pdVar20 + lVar17;
            pdVar12 = pdVar12 + lVar17;
            pdVar7 = pdVar7 + lVar17;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
        uVar19 = uVar19 + 1;
        local_a8 = local_a8 + lVar5 * 5;
        local_b0 = local_b0 + lVar5 * 5;
        local_b8 = local_b8 + lVar5 * 5;
        local_c0 = local_c0 + lVar5 * 5;
        local_c8 = local_c8 + lVar5 * 5;
        local_d0 = local_d0 + lVar4;
        local_d8 = local_d8 + lVar4;
        local_e0 = local_e0 + lVar4;
        local_e8 = local_e8 + lVar4;
        local_f0 = local_f0 + lVar4;
      } while (uVar19 != uVar1 + 1);
    }
  }
  return 0;
}

Assistant:

int c1f5kb_(int *ido, int *l1, int *na, fft_real_t *cc,
	 int *in1, fft_real_t *ch, int *in2, fft_real_t *wa)
{
    /* Initialized data */

     fft_real_t tr11 = .3090169943749474;
     fft_real_t ti11 = .9510565162951536;
     fft_real_t tr12 = -.8090169943749474;
     fft_real_t ti12 = .5877852522924731;

    /* System generated locals */
    int cc_dim1, cc_dim2, cc_dim3, cc_offset, ch_dim1, ch_dim2, ch_offset,
	     wa_dim1, wa_offset, i__1, i__2;

    /* Local variables */
     int i__, k;
     fft_real_t ci2, ci3, ci4, ci5, di3, di4, di5, di2, cr2, cr3, cr5, cr4,
	    dr3, dr4, ti2, ti3, ti4, ti5, dr5, dr2, tr2, tr3, tr4, tr5,
	    chold1, chold2;

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_offset = 1 + wa_dim1 * 5;
    wa -= wa_offset;
    cc_dim1 = *in1;
    cc_dim2 = *l1;
    cc_dim3 = *ido;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch_dim1 = *in2;
    ch_dim2 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * 6);
    ch -= ch_offset;

    /* Function Body */

/* FFTPACK 5.1 auxiliary routine */

    if (*ido > 1 || *na == 1) {
	goto L102;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ti5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	ti3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	tr5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	tr3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	chold1 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr2 + tr3;
	chold2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + ti2 + ti3;
	cr2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr11 * tr2 +
		tr12 * tr3;
	ci2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr11 * ti2 +
		tr12 * ti3;
	cr3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr12 * tr2 +
		tr11 * tr3;
	ci3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr12 * ti2 +
		tr11 * ti3;
	cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = chold1;
	cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] = chold2;
	cr5 = ti11 * tr5 + ti12 * tr4;
	ci5 = ti11 * ti5 + ti12 * ti4;
	cr4 = ti12 * tr5 - ti11 * tr4;
	ci4 = ti12 * ti5 - ti11 * ti4;
	cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] = cr2 - ci5;
	cc[(k + (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1] = cr2 + ci5;
	cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] = ci2 + cr5;
	cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] = ci3 + cr4;
	cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] = cr3 - ci4;
	cc[(k + ((cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1] = cr3 + ci4;
	cc[(k + ((cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2] = ci3 - cr4;
	cc[(k + (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2] = ci2 - cr5;
/* L101: */
    }
    return 0;
L102:
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ti5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	ti3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	tr5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	tr3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	ch[(k + ch_dim2 * 6) * ch_dim1 + 1] = cc[(k + (cc_dim3 + 1) * cc_dim2)
		 * cc_dim1 + 1] + tr2 + tr3;
	ch[(k + ch_dim2 * 6) * ch_dim1 + 2] = cc[(k + (cc_dim3 + 1) * cc_dim2)
		 * cc_dim1 + 2] + ti2 + ti3;
	cr2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr11 * tr2 +
		tr12 * tr3;
	ci2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr11 * ti2 +
		tr12 * ti3;
	cr3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr12 * tr2 +
		tr11 * tr3;
	ci3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr12 * ti2 +
		tr11 * ti3;
	cr5 = ti11 * tr5 + ti12 * tr4;
	ci5 = ti11 * ti5 + ti12 * ti4;
	cr4 = ti12 * tr5 - ti11 * tr4;
	ci4 = ti12 * ti5 - ti11 * ti4;
	ch[(k + ch_dim2 * 7) * ch_dim1 + 1] = cr2 - ci5;
	ch[(k + ch_dim2 * 10) * ch_dim1 + 1] = cr2 + ci5;
	ch[(k + ch_dim2 * 7) * ch_dim1 + 2] = ci2 + cr5;
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 2] = ci3 + cr4;
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 1] = cr3 - ci4;
	ch[(k + ch_dim2 * 9) * ch_dim1 + 1] = cr3 + ci4;
	ch[(k + ch_dim2 * 9) * ch_dim1 + 2] = ci3 - cr4;
	ch[(k + ch_dim2 * 10) * ch_dim1 + 2] = ci2 - cr5;
/* L103: */
    }
    if (*ido == 1) {
	return 0;
    }
    i__1 = *ido;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ti5 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 2] -
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 2];
	    ti2 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 2] +
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 2];
	    ti4 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 2] - cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 2];
	    ti3 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 2] + cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 2];
	    tr5 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] -
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1];
	    tr2 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] +
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1];
	    tr4 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1];
	    tr3 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1];
	    ch[(k + (i__ * 5 + 1) * ch_dim2) * ch_dim1 + 1] = cc[(k + (i__ +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr2 + tr3;
	    ch[(k + (i__ * 5 + 1) * ch_dim2) * ch_dim1 + 2] = cc[(k + (i__ +
		    cc_dim3) * cc_dim2) * cc_dim1 + 2] + ti2 + ti3;
	    cr2 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 *
		    tr2 + tr12 * tr3;
	    ci2 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 2] + tr11 *
		    ti2 + tr12 * ti3;
	    cr3 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 *
		    tr2 + tr11 * tr3;
	    ci3 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 2] + tr12 *
		    ti2 + tr11 * ti3;
	    cr5 = ti11 * tr5 + ti12 * tr4;
	    ci5 = ti11 * ti5 + ti12 * ti4;
	    cr4 = ti12 * tr5 - ti11 * tr4;
	    ci4 = ti12 * ti5 - ti11 * ti4;
	    dr3 = cr3 - ci4;
	    dr4 = cr3 + ci4;
	    di3 = ci3 + cr4;
	    di4 = ci3 - cr4;
	    dr5 = cr2 + ci5;
	    dr2 = cr2 - ci5;
	    di5 = ci2 - cr5;
	    di2 = ci2 + cr5;
	    ch[(k + (i__ * 5 + 2) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 5] * dr2 - wa[i__ + wa_dim1 * 9] * di2;
	    ch[(k + (i__ * 5 + 2) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 5] * di2 + wa[i__ + wa_dim1 * 9] * dr2;
	    ch[(k + (i__ * 5 + 3) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 6] * dr3 - wa[i__ + wa_dim1 * 10] * di3;
	    ch[(k + (i__ * 5 + 3) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 6] * di3 + wa[i__ + wa_dim1 * 10] * dr3;
	    ch[(k + (i__ * 5 + 4) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 7] * dr4 - wa[i__ + wa_dim1 * 11] * di4;
	    ch[(k + (i__ * 5 + 4) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 7] * di4 + wa[i__ + wa_dim1 * 11] * dr4;
	    ch[(k + (i__ * 5 + 5) * ch_dim2) * ch_dim1 + 1] = wa[i__ + (
		    wa_dim1 << 3)] * dr5 - wa[i__ + wa_dim1 * 12] * di5;
	    ch[(k + (i__ * 5 + 5) * ch_dim2) * ch_dim1 + 2] = wa[i__ + (
		    wa_dim1 << 3)] * di5 + wa[i__ + wa_dim1 * 12] * dr5;
/* L104: */
	}
/* L105: */
    }
    return 0;
}